

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::ArrayPtr<const_char>::findLast(ArrayPtr<const_char> *this,char *match)

{
  char *pcVar1;
  char *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  Maybe<unsigned_long> MVar3;
  Maybe<unsigned_long> MVar4;
  
  aVar2.value = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(match + 8))->value;
  do {
    MVar3.ptr.field_1.value = aVar2.value - 1;
    if (aVar2.value == 0) {
      *(undefined1 *)&this->ptr = 0;
      MVar4.ptr.field_1.value = MVar3.ptr.field_1.value;
      MVar4.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar4.ptr;
    }
    pcVar1 = (char *)(*(long *)match + -1 + aVar2.value);
    aVar2.value = MVar3.ptr.field_1.value;
  } while (*pcVar1 != *in_RDX);
  *(undefined1 *)&this->ptr = 1;
  this->size_ = (size_t)MVar3.ptr.field_1;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

inline Maybe<size_t> findLast(const T& match) const {
    for (size_t i = size_; i--;) {
      if (ptr[i] == match) {
        return i;
      }
    }
    return kj::none;
  }